

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O0

void mi_printf_amount(int64_t n,int64_t unit,mi_output_fun *out,void *arg,char *fmt)

{
  int iVar1;
  void *in_RCX;
  mi_output_fun *in_RDX;
  long in_RSI;
  long in_RDI;
  char *in_R8;
  char *pcVar2;
  char unitdesc [8];
  long frac1;
  long whole;
  int64_t tens;
  char *magnitude;
  int64_t divider;
  int64_t pos;
  int64_t base;
  char *suffix;
  int len;
  char buf [32];
  char *local_100;
  long local_e8;
  char *local_c0;
  long local_a0;
  char local_98 [8];
  long local_90;
  long local_88;
  long local_80;
  char *local_78;
  ulong local_70;
  long local_68;
  ulong local_60;
  char *local_58;
  int local_4c;
  char local_48 [8];
  long local_8;
  
  local_48[0] = '\0';
  local_4c = 0x20;
  local_58 = "B";
  if (in_RSI < 1) {
    local_58 = " ";
  }
  iVar1 = 0x400;
  if (in_RSI == 0) {
    iVar1 = 1000;
  }
  local_60 = (ulong)iVar1;
  local_8 = in_RDI;
  if (0 < in_RSI) {
    local_8 = in_RSI * in_RDI;
  }
  if (local_8 < 0) {
    local_a0 = -local_8;
  }
  else {
    local_a0 = local_8;
  }
  local_68 = local_a0;
  if (local_a0 < (long)local_60) {
    if ((local_8 != 1) || (local_100 = in_R8, *local_58 != 'B')) {
      local_c0 = local_58;
      if (local_8 == 0) {
        local_c0 = "";
      }
      _mi_snprintf(local_48,0x20,"%lld   %-3s",local_8,local_c0);
      local_100 = in_R8;
    }
  }
  else {
    local_78 = "K";
    local_70 = local_60;
    if ((long)(local_60 * local_60) <= local_a0) {
      local_70 = local_60 * local_60;
      local_78 = "M";
    }
    if ((long)(local_70 * local_60) <= local_a0) {
      local_70 = local_60 * local_70;
      local_78 = "G";
    }
    local_80 = local_8 / (long)(local_70 / 10);
    local_88 = local_80 / 10;
    local_90 = local_80 % 10;
    pcVar2 = "";
    if (local_60 == 0x400) {
      pcVar2 = "i";
    }
    _mi_snprintf(local_98,8,"%s%s%s",local_78,pcVar2,local_58);
    if (local_90 < 0) {
      local_e8 = -local_90;
    }
    else {
      local_e8 = local_90;
    }
    _mi_snprintf(local_48,(long)local_4c,"%ld.%ld %-3s",local_88,local_e8,local_98);
    local_100 = in_R8;
  }
  if (local_100 == (char *)0x0) {
    local_100 = "%12s";
  }
  _mi_fprintf(in_RDX,in_RCX,local_100,local_48);
  return;
}

Assistant:

static void mi_printf_amount(int64_t n, int64_t unit, mi_output_fun* out, void* arg, const char* fmt) {
  char buf[32]; buf[0] = 0;
  int  len = 32;
  const char* suffix = (unit <= 0 ? " " : "B");
  const int64_t base = (unit == 0 ? 1000 : 1024);
  if (unit>0) n *= unit;

  const int64_t pos = (n < 0 ? -n : n);
  if (pos < base) {
    if (n!=1 || suffix[0] != 'B') {  // skip printing 1 B for the unit column
      _mi_snprintf(buf, len, "%lld   %-3s", (long long)n, (n==0 ? "" : suffix));
    }
  }
  else {
    int64_t divider = base;
    const char* magnitude = "K";
    if (pos >= divider*base) { divider *= base; magnitude = "M"; }
    if (pos >= divider*base) { divider *= base; magnitude = "G"; }
    const int64_t tens = (n / (divider/10));
    const long whole = (long)(tens/10);
    const long frac1 = (long)(tens%10);
    char unitdesc[8];
    _mi_snprintf(unitdesc, 8, "%s%s%s", magnitude, (base==1024 ? "i" : ""), suffix);
    _mi_snprintf(buf, len, "%ld.%ld %-3s", whole, (frac1 < 0 ? -frac1 : frac1), unitdesc);
  }
  _mi_fprintf(out, arg, (fmt==NULL ? "%12s" : fmt), buf);
}